

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_BitStringCountOnes(uint *pString,int nWords)

{
  int local_28;
  int nBytes;
  int nOnes;
  int i;
  uchar *pSuppBytes;
  int nWords_local;
  uint *pString_local;
  
  local_28 = 0;
  for (nBytes = 0; nBytes < nWords << 2; nBytes = nBytes + 1) {
    local_28 = bit_count[*(byte *)((long)pString + (long)nBytes)] + local_28;
  }
  return local_28;
}

Assistant:

int Fraig_BitStringCountOnes( unsigned * pString, int nWords )
{
    unsigned char * pSuppBytes = (unsigned char *)pString;
    int i, nOnes, nBytes = sizeof(unsigned) * nWords;
    // count the number of ones in the simulation vector
    for ( i = nOnes = 0; i < nBytes; i++ )
        nOnes += bit_count[pSuppBytes[i]];
    return nOnes;
}